

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> *
tcu::operator*(Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *mtx,float scalar)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector<float,_4> *pVVar5;
  long lVar6;
  float *pfVar7;
  Matrix<float,_4,_4> *res;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar5 = (__return_storage_ptr__->m_data).m_data;
  pVVar5[3].m_data[2] = 0.0;
  pVVar5[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar5 = (__return_storage_ptr__->m_data).m_data;
  pVVar5[2].m_data[2] = 0.0;
  pVVar5[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar5 = (__return_storage_ptr__->m_data).m_data;
  pVVar5[1].m_data[2] = 0.0;
  pVVar5[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar6 = 0;
  lVar8 = 0;
  pfVar7 = (float *)__return_storage_ptr__;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar6 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar7 + lVar9) = uVar10;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x40);
    lVar8 = lVar8 + 1;
    pfVar7 = pfVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar8 != 4);
  lVar6 = 0;
  do {
    pfVar7 = (float *)((long)(mtx->m_data).m_data[0].m_data + lVar6);
    fVar2 = pfVar7[1];
    fVar3 = pfVar7[2];
    fVar4 = pfVar7[3];
    pfVar1 = (float *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar6);
    *pfVar1 = *pfVar7 * scalar;
    pfVar1[1] = fVar2 * scalar;
    pfVar1[2] = fVar3 * scalar;
    pfVar1[3] = fVar4 * scalar;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}